

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O0

bool dxil_spv::emit_sample_instruction(Op opcode,Impl *impl,CallInst *instruction)

{
  initializer_list<unsigned_int> __l;
  Operation *this;
  Builder *this_00;
  CallInst *pCVar1;
  bool bVar2;
  Id IVar3;
  ImageOperandsMask IVar4;
  Value *pVVar5;
  Type *pTVar6;
  uint uVar7;
  byte local_189;
  bool local_141;
  Id local_140;
  Id local_13c;
  Id local_138;
  Id local_134;
  initializer_list<unsigned_int> local_130;
  Operation *local_120;
  Operation *splat_op;
  ComponentType tmp;
  Type *pTStack_110;
  Id loaded_id;
  Type *target_type;
  Operation *pOStack_100;
  Id offset_vec;
  Operation *op;
  Id local_f0;
  bool grad_rewrite;
  Id IStack_ec;
  iterator local_e8;
  undefined8 local_e0;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_d8;
  Id local_bc;
  Id local_b8;
  Id sample_type;
  Id grad_y;
  Id grad_x;
  Id texel_type;
  ComponentType effective_component_type;
  Op spv_op;
  bool sparse;
  mapped_type *local_98;
  mapped_type *access_meta;
  uint min_lod_argument_index;
  uint bias_level_argument_index;
  Id min_lod_argument;
  Id bias_level_argument;
  Id dref_id;
  Id offsets [3];
  uint32_t image_ops;
  uint i;
  Id coord [4];
  uint32_t local_50;
  uint32_t local_4c;
  uint num_coords;
  uint num_coords_full;
  mapped_type *meta;
  Id local_38;
  Id combined_image_sampler_id;
  Id sampler_id;
  Id image_id;
  Builder *builder;
  bool force_explicit_lod;
  CallInst *pCStack_20;
  bool comparison_sampling;
  CallInst *instruction_local;
  Impl *impl_local;
  Op opcode_local;
  
  local_141 = true;
  if (((opcode != SampleCmp) && (local_141 = true, opcode != SampleCmpLevelZero)) &&
     (local_141 = true, opcode != SampleCmpLevel)) {
    local_141 = opcode == SampleCmpBias;
  }
  builder._7_1_ = local_141;
  builder._6_1_ = (impl->execution_mode_meta).synthesize_dummy_derivatives & 1;
  pCStack_20 = instruction;
  instruction_local = (CallInst *)impl;
  impl_local._0_4_ = opcode;
  if ((local_141 == false) &&
     (bVar2 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction), !bVar2)) {
    return true;
  }
  _sampler_id = Converter::Impl::builder((Impl *)instruction_local);
  pCVar1 = instruction_local;
  pVVar5 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,1);
  combined_image_sampler_id = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
  pCVar1 = instruction_local;
  pVVar5 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,2);
  local_38 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
  meta._4_4_ = Converter::Impl::build_sampled_image
                         ((Impl *)instruction_local,combined_image_sampler_id,local_38,
                          (bool)(builder._7_1_ & 1));
  _num_coords = std::
                unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                              *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                 _M_rehash_policy._M_next_resize,&combined_image_sampler_id);
  local_4c = 0;
  local_50 = 0;
  bVar2 = get_image_dimensions
                    ((Impl *)instruction_local,combined_image_sampler_id,&local_4c,&local_50);
  if (!bVar2) {
    return false;
  }
  memset(&image_ops,0,0x10);
  for (offsets[2] = 0; pCVar1 = instruction_local, offsets[2] < local_4c;
      offsets[2] = offsets[2] + 1) {
    pVVar5 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,offsets[2] + 3);
    IVar3 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
    (&image_ops)[offsets[2]] = IVar3;
  }
  offsets[1] = 0;
  if ((builder._6_1_ & 1) != 0) {
    if (((Op)impl_local == Sample) || ((Op)impl_local == SampleBias)) {
      impl_local._0_4_ = SampleLevel;
    }
    else if (((Op)impl_local == SampleCmp) || ((Op)impl_local == SampleCmpBias)) {
      impl_local._0_4_ = SampleCmpLevelZero;
    }
    else {
      builder._6_1_ = 0;
    }
  }
  if (((((Op)impl_local == Sample) || ((Op)impl_local == SampleBias)) ||
      ((Op)impl_local == SampleCmpBias)) || ((Op)impl_local == SampleCmp)) {
    emit_expect_assume_quad_uniform((Impl *)instruction_local);
  }
  if ((((Op)impl_local == SampleLevel) || ((Op)impl_local == SampleCmpLevelZero)) ||
     ((Op)impl_local == SampleCmpLevel)) {
    offsets[1] = offsets[1] | 2;
  }
  else if (((Op)impl_local == SampleBias) || ((Op)impl_local == SampleCmpBias)) {
    offsets[1] = offsets[1] | 1;
  }
  memset(&bias_level_argument,0,0xc);
  bVar2 = get_texel_offsets((Impl *)instruction_local,pCStack_20,offsets + 1,7,local_50,
                            &bias_level_argument,false);
  pCVar1 = instruction_local;
  if (!bVar2) {
    return false;
  }
  min_lod_argument = 0;
  if ((builder._7_1_ & 1) != 0) {
    pVVar5 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,10);
    min_lod_argument = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
  }
  bias_level_argument_index = 0;
  min_lod_argument_index = 0;
  access_meta._4_4_ = 10;
  if ((builder._7_1_ & 1) != 0) {
    access_meta._4_4_ = 0xb;
  }
  access_meta._0_4_ = 0xb;
  if ((Op)impl_local == Sample) {
    access_meta._0_4_ = 10;
  }
  else if ((Op)impl_local == SampleCmpBias) {
    access_meta._0_4_ = 0xc;
  }
  _spv_op = pCStack_20;
  local_98 = std::
             unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
             ::operator[]((unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
                           *)&instruction_local[10].super_Instruction.attachments._M_h.
                              _M_before_begin,(key_type *)&spv_op);
  effective_component_type = (local_98->access_mask & 0x10) != 0;
  if ((bool)effective_component_type) {
    spv::Builder::addCapability(_sampler_id,CapabilitySparseResidency);
  }
  if (((((Op)impl_local == Sample) || ((Op)impl_local == SampleCmp)) ||
      ((Op)impl_local == SampleBias)) || ((Op)impl_local == SampleCmpBias)) {
    pVVar5 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,(uint)access_meta);
    bVar2 = LLVMBC::isa<LLVMBC::UndefValue>(pVVar5);
    pCVar1 = instruction_local;
    if (!bVar2) {
      pVVar5 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,(uint)access_meta);
      min_lod_argument_index = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
      offsets[1] = offsets[1] | 0x80;
      spv::Builder::addCapability(_sampler_id,CapabilityMinLod);
    }
  }
  pCVar1 = instruction_local;
  if ((builder._6_1_ & 1) == 0) {
    if ((((Op)impl_local == SampleBias) || ((Op)impl_local == SampleCmpBias)) ||
       (((Op)impl_local == SampleLevel || ((Op)impl_local == SampleCmpLevel)))) {
      pVVar5 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,access_meta._4_4_);
      bias_level_argument_index = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar5,0);
    }
    else {
      bias_level_argument_index = spv::Builder::makeFloatConstant(_sampler_id,0.0,false);
    }
  }
  else {
    bias_level_argument_index = spv::Builder::makeFloatConstant(_sampler_id,0.0,false);
  }
  if ((((builder._6_1_ & 1) == 0) &&
      (((ulong)instruction_local[0x19].super_Instruction.attachments._M_h._M_single_bucket & 0x100)
       != 0)) && ((Op)impl_local == SampleLevel)) {
    bias_level_argument_index =
         emit_workaround_clamp_cube_mips
                   ((Impl *)instruction_local,combined_image_sampler_id,bias_level_argument_index);
  }
  if ((Op)impl_local - Sample < 2) {
    texel_type = 0x57;
    if ((effective_component_type & I1) != Invalid) {
      texel_type = 0x131;
    }
  }
  else if ((Op)impl_local == SampleLevel) {
    texel_type = 0x58;
    if ((effective_component_type & I1) != Invalid) {
      texel_type = 0x132;
    }
  }
  else {
    if ((Op)impl_local != SampleCmp) {
      if (((Op)impl_local == SampleCmpLevelZero) || ((Op)impl_local == SampleCmpLevel)) {
        texel_type = 0x5a;
        if ((effective_component_type & I1) != Invalid) {
          texel_type = 0x134;
        }
        goto LAB_0020ec30;
      }
      if ((Op)impl_local != SampleCmpBias) {
        return false;
      }
    }
    texel_type = 0x59;
    if ((effective_component_type & I1) != Invalid) {
      texel_type = 0x133;
    }
  }
LAB_0020ec30:
  grad_x._3_1_ = Converter::Impl::get_effective_typed_resource_type(_num_coords->component_type);
  uVar7 = 4;
  if ((builder._7_1_ & 1) != 0) {
    uVar7 = 1;
  }
  local_bc = Converter::Impl::get_type_id((Impl *)instruction_local,grad_x._3_1_,1,uVar7,false);
  pCVar1 = instruction_local;
  sample_type = 0;
  local_b8 = 0;
  grad_y = local_bc;
  if ((effective_component_type & I1) != Invalid) {
    local_f0 = spv::Builder::makeUintType(_sampler_id,0x20);
    IStack_ec = grad_y;
    local_e8 = &local_f0;
    local_e0 = 2;
    __l._M_len = 2;
    __l._M_array = local_e8;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_d8,__l,(allocator_type *)((long)&op + 7));
    local_bc = Converter::Impl::get_struct_type((Impl *)pCVar1,&local_d8,0,"SparseTexel");
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_d8);
  }
  local_189 = 0;
  if ((int)instruction_local[1].super_Instruction.attachments._M_h._M_rehash_policy._M_next_resize
      != 4) {
    local_189 = *(byte *)((long)&instruction_local[0x19].super_Instruction.operands.
                                 super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7) ^ 0xff;
  }
  op._6_1_ = local_189 & 1;
  if (op._6_1_ != 0) {
    if (texel_type == 0x57) {
      texel_type = 0x58;
    }
    else if (texel_type == 0x59) {
      texel_type = 0x5a;
    }
    else if (texel_type == 0x131) {
      texel_type = 0x132;
    }
    else if (texel_type == 0x133) {
      texel_type = 0x134;
    }
    else {
      op._6_1_ = 0;
    }
  }
  if (op._6_1_ != 0) {
    build_gradient((Impl *)instruction_local,&image_ops,local_50,&sample_type,&local_b8,
                   bias_level_argument_index,offsets + 1);
  }
  pOStack_100 = Converter::Impl::allocate
                          ((Impl *)instruction_local,texel_type,(Value *)pCStack_20,local_bc);
  pCVar1 = instruction_local;
  if ((effective_component_type & I1) == Invalid) {
    pTVar6 = LLVMBC::Value::getType((Value *)pCStack_20);
    pTVar6 = LLVMBC::Type::getStructElementType(pTVar6,0);
    Converter::Impl::decorate_relaxed_precision((Impl *)pCVar1,pTVar6,pOStack_100->id,true);
  }
  Operation::add_id(pOStack_100,meta._4_4_);
  pCVar1 = instruction_local;
  this = pOStack_100;
  IVar3 = spv::Builder::makeFloatType(_sampler_id,0x20);
  IVar3 = Converter::Impl::build_vector((Impl *)pCVar1,IVar3,&image_ops,local_4c);
  Operation::add_id(this,IVar3);
  if (min_lod_argument != 0) {
    Operation::add_id(pOStack_100,min_lod_argument);
  }
  Operation::add_literal(pOStack_100,offsets[1]);
  IVar3 = offsets[1];
  IVar4 = spv::operator|(ImageOperandsBiasMask,ImageOperandsLodMask);
  if ((IVar3 & IVar4) != ImageOperandsMaskNone) {
    Operation::add_id(pOStack_100,bias_level_argument_index);
  }
  if ((offsets[1] & 4) != 0) {
    Operation::add_id(pOStack_100,sample_type);
    Operation::add_id(pOStack_100,local_b8);
  }
  IVar3 = offsets[1];
  IVar4 = spv::operator|(ImageOperandsConstOffsetMask,ImageOperandsOffsetMask);
  if ((IVar3 & IVar4) != ImageOperandsMaskNone) {
    target_type._4_4_ =
         build_texel_offset_vector
                   ((Impl *)instruction_local,&bias_level_argument,local_50,offsets[1],false);
    Operation::add_id(pOStack_100,target_type._4_4_);
  }
  if ((offsets[1] & 0x80) != 0) {
    Operation::add_id(pOStack_100,min_lod_argument_index);
  }
  Converter::Impl::add((Impl *)instruction_local,pOStack_100,false);
  pTVar6 = LLVMBC::Value::getType((Value *)pCStack_20);
  pTStack_110 = LLVMBC::Type::getStructElementType(pTVar6,0);
  if ((effective_component_type & I1) == Invalid) {
    if ((builder._7_1_ & 1) == 0) {
      Converter::Impl::fixup_load_type_typed
                ((Impl *)instruction_local,_num_coords->component_type,4,(Value *)pCStack_20,
                 pTStack_110);
    }
    else {
      splat_op._4_4_ = pOStack_100->id;
      splat_op._3_1_ = _num_coords->component_type;
      Converter::Impl::fixup_load_type_typed
                ((Impl *)instruction_local,(ComponentType *)((long)&splat_op + 3),1,
                 (Id *)((long)&splat_op + 4),pTStack_110);
      pCVar1 = instruction_local;
      this_00 = _sampler_id;
      IVar3 = Converter::Impl::get_type_id((Impl *)instruction_local,pTStack_110,0);
      IVar3 = spv::Builder::makeVectorType(this_00,IVar3,4);
      local_120 = Converter::Impl::allocate((Impl *)pCVar1,OpCompositeConstruct,IVar3);
      local_140 = splat_op._4_4_;
      local_13c = splat_op._4_4_;
      local_138 = splat_op._4_4_;
      local_134 = splat_op._4_4_;
      local_130._M_array = &local_140;
      local_130._M_len = 4;
      Operation::add_ids(local_120,&local_130);
      Converter::Impl::add((Impl *)instruction_local,local_120,false);
      Converter::Impl::rewrite_value((Impl *)instruction_local,(Value *)pCStack_20,local_120->id);
    }
  }
  else {
    uVar7 = 4;
    if ((builder._7_1_ & 1) != 0) {
      uVar7 = 1;
    }
    Converter::Impl::repack_sparse_feedback
              ((Impl *)instruction_local,_num_coords->component_type,uVar7,(Value *)pCStack_20,
               pTStack_110,0);
  }
  build_exploded_composite_from_vector((Impl *)instruction_local,&pCStack_20->super_Instruction,4);
  return true;
}

Assistant:

bool emit_sample_instruction(DXIL::Op opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	bool comparison_sampling = opcode == DXIL::Op::SampleCmp ||
	                           opcode == DXIL::Op::SampleCmpLevelZero ||
	                           opcode == DXIL::Op::SampleCmpLevel ||
	                           opcode == DXIL::Op::SampleCmpBias;

	bool force_explicit_lod = impl.execution_mode_meta.synthesize_dummy_derivatives;

	// Elide dead loads.
	if (!comparison_sampling && !impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();

	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id sampler_id = impl.get_id_for_value(instruction->getOperand(2));
	spv::Id combined_image_sampler_id = impl.build_sampled_image(image_id, sampler_id, comparison_sampling);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	unsigned num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	spv::Id coord[4] = {};
	for (unsigned i = 0; i < num_coords_full; i++)
		coord[i] = impl.get_id_for_value(instruction->getOperand(i + 3));

	uint32_t image_ops = 0;

	if (force_explicit_lod)
	{
		if (opcode == DXIL::Op::Sample || opcode == DXIL::Op::SampleBias)
			opcode = DXIL::Op::SampleLevel;
		else if (opcode == DXIL::Op::SampleCmp || opcode == DXIL::Op::SampleCmpBias)
			opcode = DXIL::Op::SampleCmpLevelZero;
		else
			force_explicit_lod = false;
	}

	if (opcode == DXIL::Op::Sample || opcode == DXIL::Op::SampleBias ||
	    opcode == DXIL::Op::SampleCmpBias || opcode == DXIL::Op::SampleCmp)
	{
		emit_expect_assume_quad_uniform(impl);
	}

	if (opcode == DXIL::Op::SampleLevel || opcode == DXIL::Op::SampleCmpLevelZero || opcode == DXIL::Op::SampleCmpLevel)
		image_ops |= spv::ImageOperandsLodMask;
	else if (opcode == DXIL::Op::SampleBias || opcode == DXIL::Op::SampleCmpBias)
		image_ops |= spv::ImageOperandsBiasMask;

	spv::Id offsets[3] = {};
	if (!get_texel_offsets(impl, instruction, image_ops, 7, num_coords, offsets, false))
		return false;

	spv::Id dref_id = 0;

	if (comparison_sampling)
		dref_id = impl.get_id_for_value(instruction->getOperand(10));

	spv::Id bias_level_argument = 0;
	spv::Id min_lod_argument = 0;
	unsigned bias_level_argument_index = comparison_sampling ? 11 : 10;
	unsigned min_lod_argument_index = 11;

	if (opcode == DXIL::Op::Sample)
		min_lod_argument_index = 10;
	else if (opcode == DXIL::Op::SampleCmpBias)
		min_lod_argument_index = 12;

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	if (opcode == DXIL::Op::Sample || opcode == DXIL::Op::SampleCmp || opcode == DXIL::Op::SampleBias || opcode == DXIL::Op::SampleCmpBias)
	{
		if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(min_lod_argument_index)))
		{
			min_lod_argument = impl.get_id_for_value(instruction->getOperand(min_lod_argument_index));
			image_ops |= spv::ImageOperandsMinLodMask;
			builder.addCapability(spv::CapabilityMinLod);
		}
	}

	if (force_explicit_lod)
		bias_level_argument = builder.makeFloatConstant(0.0f);
	else if (opcode == DXIL::Op::SampleBias || opcode == DXIL::Op::SampleCmpBias || opcode == DXIL::Op::SampleLevel || opcode == DXIL::Op::SampleCmpLevel)
		bias_level_argument = impl.get_id_for_value(instruction->getOperand(bias_level_argument_index));
	else
		bias_level_argument = builder.makeFloatConstant(0.0f);

	if (!force_explicit_lod && impl.options.quirks.assume_broken_sub_8x8_cube_mips && opcode == DXIL::Op::SampleLevel)
		bias_level_argument = emit_workaround_clamp_cube_mips(impl, image_id, bias_level_argument);

	spv::Op spv_op;

	switch (opcode)
	{
	case DXIL::Op::SampleLevel:
		spv_op = sparse ? spv::OpImageSparseSampleExplicitLod : spv::OpImageSampleExplicitLod;
		break;

	case DXIL::Op::Sample:
	case DXIL::Op::SampleBias:
		spv_op = sparse ? spv::OpImageSparseSampleImplicitLod : spv::OpImageSampleImplicitLod;
		break;

	case DXIL::Op::SampleCmp:
	case DXIL::Op::SampleCmpBias:
		spv_op = sparse ? spv::OpImageSparseSampleDrefImplicitLod : spv::OpImageSampleDrefImplicitLod;
		break;

	case DXIL::Op::SampleCmpLevel:
	case DXIL::Op::SampleCmpLevelZero:
		spv_op = sparse ? spv::OpImageSparseSampleDrefExplicitLod : spv::OpImageSampleDrefExplicitLod;
		break;

	default:
		return false;
	}

	auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
	spv::Id texel_type = impl.get_type_id(effective_component_type, 1, comparison_sampling ? 1 : 4);
	spv::Id grad_x = 0, grad_y = 0;
	spv::Id sample_type;

	if (sparse)
		sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
	else
		sample_type = texel_type;

	bool grad_rewrite = impl.execution_model != spv::ExecutionModelFragment &&
	                    !impl.options.compute_shader_derivatives;

	if (grad_rewrite)
	{
		switch (spv_op)
		{
		case spv::OpImageSampleImplicitLod:
			spv_op = spv::OpImageSampleExplicitLod;
			break;

		case spv::OpImageSparseSampleImplicitLod:
			spv_op = spv::OpImageSparseSampleExplicitLod;
			break;

		case spv::OpImageSampleDrefImplicitLod:
			spv_op = spv::OpImageSampleDrefExplicitLod;
			break;

		case spv::OpImageSparseSampleDrefImplicitLod:
			spv_op = spv::OpImageSparseSampleDrefExplicitLod;
			break;

		default:
			grad_rewrite = false;
			break;
		}
	}

	if (grad_rewrite)
		build_gradient(impl, coord, num_coords, grad_x, grad_y, bias_level_argument, image_ops);

	// Comparison sampling only returns a scalar, so we'll need to splat out result.
	Operation *op = impl.allocate(spv_op, instruction, sample_type);

	if (!sparse)
		impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

	op->add_id(combined_image_sampler_id);
	op->add_id(impl.build_vector(builder.makeFloatType(32), coord, num_coords_full));

	if (dref_id)
		op->add_id(dref_id);

	op->add_literal(image_ops);

	if (image_ops & (spv::ImageOperandsBiasMask | spv::ImageOperandsLodMask))
		op->add_id(bias_level_argument);

	if (image_ops & spv::ImageOperandsGradMask)
	{
		op->add_id(grad_x);
		op->add_id(grad_y);
	}

	if (image_ops & (spv::ImageOperandsConstOffsetMask | spv::ImageOperandsOffsetMask))
	{
		spv::Id offset_vec = build_texel_offset_vector(impl, offsets, num_coords, image_ops, false);
		op->add_id(offset_vec);
	}

	if (image_ops & spv::ImageOperandsMinLodMask)
		op->add_id(min_lod_argument);

	impl.add(op);

	auto *target_type = instruction->getType()->getStructElementType(0);

	if (sparse)
	{
		// Repack return arguments from { i32, Tx4 } into { T, T, T, T, i32 } which DXIL expects.
		impl.repack_sparse_feedback(meta.component_type, comparison_sampling ? 1 : 4, instruction, target_type);
	}
	else if (comparison_sampling)
	{
		spv::Id loaded_id = op->id;
		auto tmp = meta.component_type;
		impl.fixup_load_type_typed(tmp, 1, loaded_id, target_type);
		Operation *splat_op =
			impl.allocate(spv::OpCompositeConstruct, builder.makeVectorType(impl.get_type_id(target_type), 4));
		splat_op->add_ids({ loaded_id, loaded_id, loaded_id, loaded_id });
		impl.add(splat_op);
		impl.rewrite_value(instruction, splat_op->id);
	}
	else
	{
		impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
	}

	build_exploded_composite_from_vector(impl, instruction, 4);

	return true;
}